

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

void __thiscall soul::Optimisations::Inliner::perform(Inliner *this)

{
  string *__rhs;
  Module *pMVar1;
  Function *pFVar2;
  size_t blockIndex;
  Iterator lastStatementOfFirstBlock;
  Block *pBVar3;
  Allocator *this_00;
  FunctionCall *pFVar4;
  pointer ppVar5;
  pointer ppVar6;
  Block *pBVar7;
  Variable *pVVar8;
  Expression *args_1;
  AssignFromValue *pAVar9;
  pool_ref<soul::heart::Variable> *ppVar10;
  string *psVar11;
  Variable *dest;
  pool_ref<soul::heart::Expression> *ppVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  Branch *pBVar15;
  ulong uVar16;
  size_t i;
  pointer ppVar17;
  BlockBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newParamName;
  undefined1 local_f8 [32];
  _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_d8;
  vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
  *local_d0;
  pointer local_c8;
  Type local_c0;
  Type local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  pMVar1 = this->module;
  pFVar2 = this->parentFunction;
  blockIndex = this->blockIndex;
  lastStatementOfFirstBlock.object = (Statement *)this->call;
  __rhs = &this->inlinedFnName;
  std::operator+(&newParamName,"@",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder,
                 &newParamName,"_end");
  pBVar7 = heart::Utilities::splitBlock
                     (pMVar1,pFVar2,blockIndex,lastStatementOfFirstBlock,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&newParamName);
  (this->postCallResumeBlock).object = pBVar7;
  pBVar3 = (this->parentFunction->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->blockIndex].object;
  LinkedList<soul::heart::Statement>::remove(&pBVar3->statements,(char *)this->call);
  if ((this->targetFunction->returnType).primitiveType.type != void_) {
    pMVar1 = this->module;
    Type::Type(&local_a8,&this->targetFunction->returnType);
    this_00 = this->module->allocator;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder,
                   __rhs,"_retval");
    newParamName._M_dataplus._M_p =
         (pointer)heart::Allocator::get<std::__cxx11::string>
                            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&builder);
    pVVar8 = BlockBuilder::createVariable<soul::Identifier>
                       (pMVar1,&local_a8,(Identifier *)&newParamName,mutableLocal);
    (this->returnValueVar).object = pVVar8;
    std::__cxx11::string::~string((string *)&builder);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_a8.structure);
    pMVar1 = this->module;
    pFVar4 = this->call;
    args_1 = pool_ptr<soul::heart::Expression>::operator*(&(pFVar4->super_Assignment).target);
    pVVar8 = pool_ptr<soul::heart::Variable>::operator*(&this->returnValueVar);
    pAVar9 = Module::
             allocate<soul::heart::AssignFromValue,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Variable&>
                       (pMVar1,&(pFVar4->super_Assignment).super_Statement.super_Object.location,
                        args_1,pVVar8);
    (pAVar9->super_Assignment).super_Statement.nextObject = (pBVar7->statements).firstObject;
    (pBVar7->statements).firstObject = (Statement *)pAVar9;
  }
  builder.module = this->module;
  builder._vptr_BlockBuilder = (_func_int **)&PTR__BlockBuilder_00332dc8;
  builder.lastStatementInCurrentBlock.object = (Statement *)0x0;
  builder.currentBlock.object = pBVar3;
  builder.lastStatementInCurrentBlock =
       LinkedList<soul::heart::Statement>::getLast(&pBVar3->statements);
  for (uVar16 = 0; pFVar2 = this->targetFunction, uVar16 < (pFVar2->parameters).numActive;
      uVar16 = uVar16 + 1) {
    ppVar10 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::operator[]
                        (&pFVar2->parameters,uVar16);
    pVVar8 = ppVar10->object;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   __rhs,"_param_");
    psVar11 = Identifier::operator_cast_to_string_(&pVVar8->name);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar11);
    makeSafeIdentifierName(&local_90,&local_50);
    std::operator+(&newParamName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_f8);
    Type::Type(&local_c0,&pVVar8->type);
    std::__cxx11::string::string((string *)&local_70,(string *)&newParamName);
    dest = BlockBuilder::createMutableLocalVariable(&builder,&local_c0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_c0.structure);
    ppVar12 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator[]
                        (&this->call->arguments,uVar16);
    BlockBuilder::addAssignment(&builder,&dest->super_Expression,ppVar12->object);
    local_f8._0_8_ = pVVar8;
    pmVar13 = std::__detail::
              _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->remappedVariables,(key_type *)local_f8);
    pmVar13->object = dest;
    std::__cxx11::string::~string((string *)&newParamName);
  }
  local_d0 = (vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
              *)&this->newBlocks;
  std::
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>::
  reserve((vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           *)local_d0,
          (long)(pFVar2->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pFVar2->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_c8 = (this->targetFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = (_Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->remappedBlocks;
  for (ppVar17 = (this->targetFunction->blocks).
                 super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar17 != local_c8;
      ppVar17 = ppVar17 + 1) {
    std::operator+(&newParamName,"@",__rhs);
    ppVar5 = (this->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (this->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar5 == ppVar6) {
      local_f8._0_8_ = local_f8 + 0x10;
      local_f8._8_8_ = 0;
      local_f8[0x10] = '\0';
    }
    else {
      std::__cxx11::to_string(&local_90,(long)ppVar6 - (long)ppVar5 >> 3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "_",&local_90);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder,
                   &newParamName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    if (ppVar5 != ppVar6) {
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&newParamName);
    pMVar1 = this->module;
    newParamName._M_dataplus._M_p =
         (pointer)heart::Allocator::get<std::__cxx11::string>
                            (pMVar1->allocator,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &builder);
    pBVar7 = Module::allocate<soul::heart::Block,soul::Identifier>
                       (pMVar1,(Identifier *)&newParamName);
    newParamName._M_dataplus._M_p = (pointer)pBVar7;
    std::
    vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>::
    emplace_back<soul::pool_ref<soul::heart::Block>>
              (local_d0,(pool_ref<soul::heart::Block> *)&newParamName);
    pmVar14 = std::__detail::
              _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](local_d8,ppVar17);
    pmVar14->object = pBVar7;
    std::__cxx11::string::~string((string *)&builder);
  }
  std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
  ::
  insert<__gnu_cxx::__normal_iterator<soul::pool_ref<soul::heart::Block>*,std::vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>>,void>
            ((vector<soul::pool_ref<soul::heart::Block>,std::allocator<soul::pool_ref<soul::heart::Block>>>
              *)&this->parentFunction->blocks,
             (this->parentFunction->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->blockIndex + 1,
             (this->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->newBlocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pBVar15 = Module::allocate<soul::heart::Branch,soul::pool_ref<soul::heart::Block>&>
                      (this->module,
                       (this->newBlocks).
                       super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  (pBVar3->terminator).object = &pBVar15->super_Terminator;
  for (uVar16 = 0;
      ppVar17 = (this->newBlocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(this->newBlocks).
                             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar17 >> 3);
      uVar16 = uVar16 + 1) {
    cloneBlock(this,ppVar17[uVar16].object,
               (this->targetFunction->blocks).
               super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].object);
  }
  return;
}

Assistant:

void perform()
        {
            auto& postBlock = heart::Utilities::splitBlock (module, parentFunction, blockIndex, call, "@" + inlinedFnName + "_end");
            postCallResumeBlock = postBlock;
            auto& preBlock = parentFunction.blocks[blockIndex].get();

            preBlock.statements.remove (call);

            if (! targetFunction.returnType.isVoid())
            {
                returnValueVar = BlockBuilder::createVariable (module, targetFunction.returnType,
                                                               module.allocator.get (inlinedFnName + "_retval"),
                                                               heart::Variable::Role::mutableLocal);

                postBlock.statements.insertFront (module.allocate<heart::AssignFromValue> (call.location, *call.target, *returnValueVar));
            }

            {
                BlockBuilder builder (module, preBlock);

                for (size_t i = 0; i < targetFunction.parameters.size(); ++i)
                {
                    auto& param = targetFunction.parameters[i].get();
                    auto newParamName = inlinedFnName + "_param_" + makeSafeIdentifierName (param.name);
                    auto& localParamVar = builder.createMutableLocalVariable (param.type, newParamName);
                    builder.addAssignment (localParamVar, call.arguments[i]);
                    remappedVariables[param] = localParamVar;
                }
            }

            newBlocks.reserve (targetFunction.blocks.size());

            for (auto& b : targetFunction.blocks)
            {
                // NB: the name of the first block must be "@" + inlinedFnName, since that's what the unique
                // name picker will look for to make sure there's not a block name clash
                auto name = "@" + inlinedFnName + (newBlocks.empty() ? std::string() : ("_" + std::to_string (newBlocks.size())));
                auto& newBlock = module.allocate<heart::Block> (module.allocator.get (name));
                newBlocks.push_back (newBlock);
                remappedBlocks[b] = newBlock;
            }

            parentFunction.blocks.insert (getIteratorForIndex (parentFunction.blocks, blockIndex + 1),
                                          newBlocks.begin(), newBlocks.end());

            preBlock.terminator = module.allocate<heart::Branch> (newBlocks.front());

            for (size_t i = 0; i < newBlocks.size(); ++i)
                cloneBlock (newBlocks[i], targetFunction.blocks[i]);
        }